

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_sG(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  double dVar2;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  dVar2 = YfromRGBint(in->r,in->g,in->b);
  bVar1 = sRGB(dVar2 / 65535.0);
  out->b = (uint)bVar1;
  out->g = (uint)bVar1;
  out->r = (uint)bVar1;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_sG(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   out->r = out->g = out->b = sRGB(YfromRGBint(in->r, in->g, in->b)/65535);
   out->a = 255;
}